

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8to_mb(char *src,uint srclen,char *dst,uint dstlen)

{
  wchar_t wVar1;
  uint uVar2;
  size_t sVar3;
  uint local_1048;
  wchar_t ret;
  uint length;
  wchar_t *buf;
  wchar_t lbuf [1024];
  uint dstlen_local;
  char *dst_local;
  uint srclen_local;
  char *src_local;
  
  wVar1 = fl_utf8locale();
  if (wVar1 == L'\0') {
    _ret = &buf;
    uVar2 = fl_utf8towc(src,srclen,(wchar_t *)_ret,0x400);
    if (0x3ff < uVar2) {
      _ret = (wchar_t **)malloc((ulong)(uVar2 + 1) << 2);
      fl_utf8towc(src,srclen,(wchar_t *)_ret,uVar2 + 1);
    }
    if (dstlen == 0) {
      sVar3 = wcstombs((char *)0x0,(wchar_t *)_ret,0);
      local_1048 = (uint)sVar3;
    }
    else {
      sVar3 = wcstombs(dst,(wchar_t *)_ret,(ulong)dstlen);
      local_1048 = (uint)sVar3;
      if ((int)(dstlen - 1) <= (int)local_1048) {
        sVar3 = wcstombs((char *)0x0,(wchar_t *)_ret,0);
        local_1048 = (uint)sVar3;
      }
    }
    if (_ret != &buf) {
      free(_ret);
    }
    if (-1 < (int)local_1048) {
      return local_1048;
    }
  }
  if (srclen < dstlen) {
    memcpy(dst,src,(ulong)srclen);
    dst[srclen] = '\0';
  }
  return srclen;
}

Assistant:

unsigned fl_utf8to_mb(const char* src, unsigned srclen,
		  char* dst, unsigned dstlen)
{
  if (!fl_utf8locale()) {
#ifdef WIN32
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    unsigned length = fl_utf8towc(src, srclen, buf, 1024);
    unsigned ret;
    if (length >= 1024) {
      buf = (wchar_t*)(malloc((length+1)*sizeof(wchar_t)));
      fl_utf8towc(src, srclen, buf, length+1);
    }
    if (dstlen) {
      /* apparently this does not null-terminate, even though msdn
       * documentation claims it does:
       */
      ret =
        WideCharToMultiByte(GetACP(), 0, buf, length, dst, dstlen, 0, 0);
      dst[ret] = 0;
    }
    /* if it overflows or measuring length, get the actual length: */
    if (dstlen==0 || ret >= dstlen-1)
      ret =
	WideCharToMultiByte(GetACP(), 0, buf, length, 0, 0, 0, 0);
    if (buf != lbuf) free((void*)buf);
    return ret;
#else
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    unsigned length = fl_utf8towc(src, srclen, buf, 1024);
    int ret; /* note: wcstombs() returns unsigned(length) or unsigned(-1) */
    if (length >= 1024) {
      buf = (wchar_t*)(malloc((length+1)*sizeof(wchar_t)));
      fl_utf8towc(src, srclen, buf, length+1);
    }
    if (dstlen) {
      ret = wcstombs(dst, buf, dstlen);
      if (ret >= (int)dstlen-1) ret = wcstombs(0,buf,0);
    } else {
      ret = wcstombs(0,buf,0);
    }
    if (buf != lbuf) free((void*)buf);
    if (ret >= 0) return (unsigned)ret;
    /* on any errors we return the UTF-8 as raw text...*/
#endif
  }
  /* identity transform: */
  if (srclen < dstlen) {
    memcpy(dst, src, srclen);
    dst[srclen] = 0;
  } else {
    /* Buffer insufficent or buffer query */
  }
  return srclen;
}